

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O3

Dec_Graph_t * Abc_ManResubQuit1(Abc_Obj_t *pRoot,Abc_Obj_t *pObj0,Abc_Obj_t *pObj1,int fOrGate)

{
  Dec_Graph_t *pDVar1;
  Dec_Node_t *pDVar2;
  Dec_Edge_t DVar3;
  uint uVar4;
  Dec_Edge_t DVar5;
  void *pvVar6;
  void *pvVar7;
  uint uVar8;
  Dec_Edge_t DVar9;
  
  pvVar7 = (void *)((ulong)pObj0 & 0xfffffffffffffffe);
  pvVar6 = (void *)((ulong)pObj1 & 0xfffffffffffffffe);
  if (pvVar7 != pvVar6) {
    pDVar1 = (Dec_Graph_t *)calloc(1,0x20);
    pDVar1->nLeaves = 2;
    pDVar1->nCap = 0x36;
    pDVar2 = (Dec_Node_t *)malloc(0x510);
    pDVar1->pNodes = pDVar2;
    pDVar2->eEdge0 = (Dec_Edge_t)0x0;
    pDVar2->eEdge1 = (Dec_Edge_t)0x0;
    (pDVar2->field_2).pFunc = (void *)0x0;
    pDVar2[1].field_2.pFunc = (void *)0x0;
    *(undefined8 *)&pDVar2[1].field_0x10 = 0;
    *(undefined8 *)&pDVar2->field_0x10 = 0;
    pDVar2[1].eEdge0 = (Dec_Edge_t)0x0;
    pDVar2[1].eEdge1 = (Dec_Edge_t)0x0;
    (pDVar2->field_2).pFunc = pvVar7;
    pDVar2[1].field_2.pFunc = pvVar6;
    DVar5 = (Dec_Edge_t)(((uint)pObj0 ^ *(uint *)((long)pvVar7 + 0x14) >> 7) & 1);
    uVar8 = ((uint)pObj1 ^ *(uint *)((long)pvVar6 + 0x14) >> 7) & 1;
    if (fOrGate == 0) {
      DVar9 = (Dec_Edge_t)(uVar8 + 2);
      pDVar1->nSize = 3;
      pDVar2[2].field_2.pFunc = (void *)0x0;
      *(undefined8 *)&pDVar2[2].field_0x10 = 0;
      uVar4 = uVar8 << 0x10 | (int)DVar5 << 0xf;
      DVar3 = (Dec_Edge_t)0x4;
    }
    else {
      pDVar1->nSize = 3;
      pDVar2[2].field_2.pFunc = (void *)0x0;
      *(undefined8 *)&pDVar2[2].field_0x10 = 0;
      uVar4 = uVar8 * 0x10000 + (int)DVar5 * 0x8000 + 0x4000;
      DVar5 = (Dec_Edge_t)((uint)DVar5 ^ 1);
      DVar9 = (Dec_Edge_t)(uVar8 ^ 3);
      DVar3 = (Dec_Edge_t)0x5;
    }
    pDVar2[2].eEdge0 = DVar5;
    pDVar2[2].eEdge1 = DVar9;
    *(uint *)&pDVar2[2].field_0x10 = uVar4;
    pDVar1->eRoot = DVar3;
    if ((pRoot->field_0x14 & 0x80) != 0) {
      pDVar1->eRoot = (Dec_Edge_t)((uint)DVar3 ^ 1);
    }
    return pDVar1;
  }
  __assert_fail("Abc_ObjRegular(pObj0) != Abc_ObjRegular(pObj1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                ,0x28d,"Dec_Graph_t *Abc_ManResubQuit1(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, int)")
  ;
}

Assistant:

Dec_Graph_t * Abc_ManResubQuit1( Abc_Obj_t * pRoot, Abc_Obj_t * pObj0, Abc_Obj_t * pObj1, int fOrGate )
{
    Dec_Graph_t * pGraph;
    Dec_Edge_t eRoot, eNode0, eNode1;
    assert( Abc_ObjRegular(pObj0) != Abc_ObjRegular(pObj1) );
    pGraph = Dec_GraphCreate( 2 );
    Dec_GraphNode( pGraph, 0 )->pFunc = Abc_ObjRegular(pObj0);
    Dec_GraphNode( pGraph, 1 )->pFunc = Abc_ObjRegular(pObj1);
    eNode0 = Dec_EdgeCreate( 0, Abc_ObjRegular(pObj0)->fPhase ^ Abc_ObjIsComplement(pObj0) );
    eNode1 = Dec_EdgeCreate( 1, Abc_ObjRegular(pObj1)->fPhase ^ Abc_ObjIsComplement(pObj1) );
    if ( fOrGate ) 
        eRoot  = Dec_GraphAddNodeOr( pGraph, eNode0, eNode1 );
    else
        eRoot  = Dec_GraphAddNodeAnd( pGraph, eNode0, eNode1 );
    Dec_GraphSetRoot( pGraph, eRoot );
    if ( pRoot->fPhase )
        Dec_GraphComplement( pGraph );
    return pGraph;
}